

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdManifoldMesh.cpp
# Opt level: O2

bool __thiscall HACD::TMMesh::Normalize(TMMesh *this)

{
  double dVar1;
  double dVar2;
  size_t sVar3;
  CircularListElement<HACD::TMMVertex> *pCVar4;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_ZMM3 [64];
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  
  sVar3 = (this->m_vertices).m_size;
  if (sVar3 != 0) {
    pCVar4 = (this->m_vertices).m_head;
    local_40 = (pCVar4->m_data).m_pos.m_data[0];
    (this->m_barycenter).m_data[0] = local_40;
    local_48 = (pCVar4->m_data).m_pos.m_data[1];
    (this->m_barycenter).m_data[1] = local_48;
    local_50 = (pCVar4->m_data).m_pos.m_data[2];
    (this->m_barycenter).m_data[2] = local_50;
    local_38 = local_50;
    local_30 = local_48;
    local_28 = local_40;
    for (sVar6 = 1; sVar3 != sVar6; sVar6 = sVar6 + 1) {
      Vec3<double>::operator+=(&this->m_barycenter,(Vec3<double> *)pCVar4);
      pCVar4 = (this->m_vertices).m_head;
      dVar8 = (pCVar4->m_data).m_pos.m_data[0];
      dVar1 = dVar8;
      if ((local_28 <= dVar8) && (dVar1 = local_28, local_40 < dVar8)) {
        local_40 = dVar8;
      }
      local_28 = dVar1;
      dVar8 = (pCVar4->m_data).m_pos.m_data[1];
      dVar1 = (pCVar4->m_data).m_pos.m_data[2];
      dVar2 = dVar8;
      if ((local_30 <= dVar8) && (dVar2 = local_30, local_48 < dVar8)) {
        local_48 = dVar8;
      }
      local_30 = dVar2;
      dVar8 = dVar1;
      if ((local_38 <= dVar1) && (dVar8 = local_38, local_50 < dVar1)) {
        local_50 = dVar1;
      }
      local_38 = dVar8;
      if ((this->m_vertices).m_size != 0) {
        pCVar4 = pCVar4->m_next;
        (this->m_vertices).m_head = pCVar4;
      }
    }
    auVar9 = vcvtusi2sd_avx512f(in_ZMM3._0_16_,sVar3);
    Vec3<double>::operator/=(&this->m_barycenter,auVar9._0_8_);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_40 - local_28;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (local_48 - local_30) * (local_48 - local_30);
    auVar9 = vfmadd231sd_fma(auVar10,auVar9,auVar9);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_50 - local_38;
    auVar9 = vfmadd231sd_fma(auVar9,auVar11,auVar11);
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    dVar8 = auVar9._0_8_ * 0.001;
    this->m_diag = dVar8;
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      pCVar4 = (this->m_vertices).m_head;
      sVar6 = (this->m_vertices).m_size;
      dVar8 = 1.0 / dVar8;
      sVar5 = sVar3;
      while (bVar7 = sVar5 != 0, sVar5 = sVar5 - 1, bVar7) {
        dVar1 = (pCVar4->m_data).m_pos.m_data[2];
        dVar2 = (this->m_barycenter).m_data[2];
        auVar9 = vsubpd_avx(*(undefined1 (*) [16])(pCVar4->m_data).m_pos.m_data,
                            *(undefined1 (*) [16])(this->m_barycenter).m_data);
        (pCVar4->m_data).m_pos.m_data[0] = dVar8 * auVar9._0_8_;
        (pCVar4->m_data).m_pos.m_data[1] = dVar8 * auVar9._8_8_;
        (pCVar4->m_data).m_pos.m_data[2] = dVar8 * (dVar1 - dVar2);
        if (sVar6 != 0) {
          pCVar4 = pCVar4->m_next;
          (this->m_vertices).m_head = pCVar4;
        }
      }
    }
  }
  return sVar3 != 0;
}

Assistant:

void TMMEdge::Initialize()
	{
        m_id = 0;
		m_triangles[0] = m_triangles[1] = m_newFace = 0;
		m_vertices[0] = m_vertices[1] = 0;
    }